

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>
::
Naive_vector_column<std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>>
          (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>
           *this,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>
                 *column,Index columnIndex,
          vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  uint uVar1;
  size_type new_size;
  stored_size_type sVar2;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
  *this_00;
  Field_operators *pFVar3;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
  *__v;
  pointer psVar4;
  pointer ppEVar5;
  Field_operators *pFVar6;
  long lVar7;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
  *local_38;
  
  *(Index *)this = columnIndex;
  *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(undefined8 *)(this + 0x10) = *(undefined8 *)&column->super_Column_dimension_option;
  *(Index *)(this + 0x18) = (column->super_Chain_column_option).pairedColumn_;
  new_size = (column->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size;
  local_38 = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
              *)0x0;
  *(Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>
    **)(this + 0x20) = this + 0x38;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 8;
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,boost::container::new_allocator<void>,void>,void>
  ::
  priv_resize<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*>
            ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,boost::container::new_allocator<void>,void>,void>
              *)(this + 0x20),new_size,&local_38);
  pFVar6 = (Field_operators *)0x0;
  pFVar3 = column->operators_;
  if (colSettings != (Column_settings *)0x0) {
    pFVar3 = pFVar6;
  }
  *(Field_operators **)(this + 0x78) = pFVar3;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x80) = colSettings;
  sVar2 = (column->column_).
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size;
  if (sVar2 != 0) {
    ppEVar5 = (column->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    lVar7 = sVar2 << 3;
    do {
      if (ppEVar5 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> **, IsConst = true]"
                     );
      }
      uVar1 = (*ppEVar5)->rowIndex_;
      __v = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
             *)operator_new(8);
      (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
      __v->rowIndex_ = uVar1;
      if (*(Field_operators **)(this + 0x28) <= pFVar6) {
        __assert_fail("this->m_holder.m_size > n","/usr/include/boost/container/vector.hpp",0x644,
                      "reference boost::container::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> *, boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> *, boost::container::new_allocator<void>, void>>::operator[](size_type) [T = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> *, A = boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, false>>> *, boost::container::new_allocator<void>, void>, Options = void]"
                     );
      }
      *(Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>
        **)(*(long *)(this + 0x20) + (long)pFVar6 * 8) = __v;
      this_00 = *(vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
                  **)(this + 8);
      if (this_00 !=
          (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
           *)0x0) {
        psVar4 = (this_00->
                 super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this_00->
                           super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) *
                   -0x5555555555555555) < (ulong)(uVar1 + 1)) {
          std::
          vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
          ::resize(this_00,(ulong)(uVar1 + 1));
          psVar4 = (pointer)**(undefined8 **)(this + 8);
        }
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>const&>
                  ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>
                    *)(psVar4 + uVar1),__v);
      }
      pFVar6 = (Field_operators *)(ulong)((int)pFVar6 + 1);
      ppEVar5 = ppEVar5 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Naive_vector_column& column,
                                                               Index columnIndex,
                                                               Row_container* rowContainer,
                                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}